

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadDsd.c
# Opt level: O3

Abc_Ntk_t * Io_ReadDsd(char *pForm)

{
  int iVar1;
  char *pcVar2;
  Abc_Ntk_t *pNtk;
  Vec_Ptr_t *vNames;
  Abc_Obj_t *pAVar3;
  size_t sVar4;
  byte *pbVar5;
  Abc_Obj_t *pObj;
  char cVar6;
  byte bVar7;
  uint uVar8;
  uint uVar9;
  Abc_Ntk_t *pAVar10;
  ulong uVar11;
  
  cVar6 = *pForm;
  if (cVar6 == '\0') {
    uVar9 = 1;
  }
  else {
    pcVar2 = pForm + 1;
    uVar9 = 0;
    do {
      bVar7 = cVar6 + 0x9f;
      uVar8 = (uint)bVar7;
      if (bVar7 < uVar9) {
        uVar8 = uVar9;
      }
      if (0x19 < bVar7) {
        uVar8 = uVar9;
      }
      uVar9 = uVar8;
      cVar6 = *pcVar2;
      pcVar2 = pcVar2 + 1;
    } while (cVar6 != '\0');
    uVar9 = uVar9 + 1;
  }
  pNtk = Abc_NtkAlloc(ABC_NTK_LOGIC,ABC_FUNC_SOP,1);
  pcVar2 = Extra_UtilStrsav("dsd");
  pNtk->pName = pcVar2;
  vNames = Abc_NodeGetFakeNames(uVar9);
  uVar11 = 0;
  do {
    pAVar3 = Abc_NtkCreateObj(pNtk,ABC_OBJ_PI);
    if ((long)vNames->nSize <= (long)uVar11) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                    ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
    }
    Abc_ObjAssignName(pAVar3,(char *)vNames->pArray[uVar11],(char *)0x0);
    uVar11 = uVar11 + 1;
  } while (uVar9 != uVar11);
  Abc_NodeFreeNames(vNames);
  sVar4 = strlen(pForm);
  pcVar2 = (char *)malloc(sVar4 * 3 + 10);
  *pcVar2 = '(';
  pbVar5 = (byte *)(pcVar2 + 1);
  do {
    bVar7 = *pForm;
    if (bVar7 < 0x29) {
      if (bVar7 == 0x28) {
        pbVar5[0] = 0x28;
        pbVar5[1] = 0x28;
        goto LAB_002d3643;
      }
      if (bVar7 == 0) {
        pbVar5[0] = 0x29;
        pbVar5[1] = 0;
        pAVar3 = Io_ReadDsd_rec(pNtk,pcVar2,(char *)0x0);
        free(pcVar2);
        pAVar10 = (Abc_Ntk_t *)0x0;
        if (pAVar3 != (Abc_Obj_t *)0x0) {
          pObj = Abc_NtkCreateObj(pNtk,ABC_OBJ_PO);
          Abc_ObjAssignName(pObj,"F",(char *)0x0);
          Abc_ObjAddFanin(pObj,pAVar3);
          iVar1 = Abc_NtkCheck(pNtk);
          pAVar10 = pNtk;
          if (iVar1 == 0) {
            fwrite("Io_ReadDsd(): Network check has failed.\n",0x28,1,_stdout);
            Abc_NtkDelete(pNtk);
            pAVar10 = (Abc_Ntk_t *)0x0;
          }
        }
        return pAVar10;
      }
LAB_002d364d:
      *pbVar5 = bVar7;
      pbVar5 = pbVar5 + 1;
    }
    else if (bVar7 == 0x29) {
      pbVar5[0] = 0x29;
      pbVar5[1] = 0x29;
LAB_002d3643:
      pbVar5 = pbVar5 + 2;
    }
    else {
      if (bVar7 != 0x2c) goto LAB_002d364d;
      pbVar5[0] = 0x29;
      pbVar5[1] = 0x2c;
      pbVar5[2] = 0x28;
      pbVar5 = pbVar5 + 3;
    }
    pForm = (char *)((byte *)pForm + 1);
  } while( true );
}

Assistant:

Abc_Ntk_t * Io_ReadDsd( char * pForm )
{
    Abc_Ntk_t * pNtk;
    Abc_Obj_t * pObj, * pTop;
    Vec_Ptr_t * vNames;
    char * pCur, * pFormCopy;
    int i, nInputs;

    // count the number of elementary variables
    nInputs = 0;
    for ( pCur = pForm; *pCur; pCur++ )
        if ( *pCur >= 'a' && *pCur <= 'z' )
            nInputs = Abc_MaxInt( nInputs, *pCur - 'a' );
    nInputs++;

    // create the network
    pNtk = Abc_NtkAlloc( ABC_NTK_LOGIC, ABC_FUNC_SOP, 1 );
    pNtk->pName = Extra_UtilStrsav( "dsd" );

    // create PIs
    vNames = Abc_NodeGetFakeNames( nInputs );
    for ( i = 0; i < nInputs; i++ )
        Abc_ObjAssignName( Abc_NtkCreatePi(pNtk), (char *)Vec_PtrEntry(vNames, i), NULL );
    Abc_NodeFreeNames( vNames );

    // transform the formula by inserting parentheses
    // this transforms strings like PRIME(a,b,cd) into (PRIME((a),(b),(cd)))
    pCur = pFormCopy = ABC_ALLOC( char, 3 * strlen(pForm) + 10 );
    *pCur++ = '(';
    for ( ; *pForm; pForm++ )
        if ( *pForm == '(' )
        {
            *pCur++ = '(';
            *pCur++ = '(';
        }
        else if ( *pForm == ')' )
        {
            *pCur++ = ')';
            *pCur++ = ')';
        }
        else if ( *pForm == ',' )
        {
            *pCur++ = ')';
            *pCur++ = ',';
            *pCur++ = '(';
        }
        else
            *pCur++ = *pForm;
    *pCur++ = ')';
    *pCur = 0;

    // parse the formula
    pObj = Io_ReadDsd_rec( pNtk, pFormCopy, NULL );
    ABC_FREE( pFormCopy );
    if ( pObj == NULL )
        return NULL;

    // create output
    pTop = Abc_NtkCreatePo(pNtk);
    Abc_ObjAssignName( pTop, "F", NULL );
    Abc_ObjAddFanin( pTop, pObj );

    // create the only PO
    if ( !Abc_NtkCheck( pNtk ) )
    {
        fprintf( stdout, "Io_ReadDsd(): Network check has failed.\n" );
        Abc_NtkDelete( pNtk );
        return NULL;
    }
    return pNtk;
}